

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O0

void transpose_xyz_aos_to_soa(char *filename)

{
  int val;
  uint local_5c;
  float *pfStack_58;
  uint32_t i_1;
  float *vertices_from_xyz;
  float *pfStack_48;
  uint32_t i;
  float *z;
  float *y;
  float *x;
  uint32_t *triangles;
  float *pfStack_20;
  uint32_t nr_of_triangles;
  float *vertices;
  char *pcStack_10;
  uint32_t nr_of_vertices;
  char *filename_local;
  
  pcStack_10 = filename;
  val = trico_read_stl((uint32_t *)((long)&vertices + 4),&stack0xffffffffffffffe0,
                       (uint32_t *)((long)&triangles + 4),(uint32_t **)&x,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                  ,0x29,"void transpose_xyz_aos_to_soa(const char *)");
  y = (float *)trico_malloc((ulong)vertices._4_4_ << 2);
  z = (float *)trico_malloc((ulong)vertices._4_4_ << 2);
  pfStack_48 = (float *)trico_malloc((ulong)vertices._4_4_ << 2);
  anon_unknown.dwarf_cde::tic();
  trico_transpose_xyz_aos_to_soa(&y,&z,&stack0xffffffffffffffb8,pfStack_20,vertices._4_4_);
  anon_unknown.dwarf_cde::toc("transpose_xyz_aos_to_soa time: ");
  for (vertices_from_xyz._4_4_ = 0; vertices_from_xyz._4_4_ < vertices._4_4_;
      vertices_from_xyz._4_4_ = vertices_from_xyz._4_4_ + 1) {
    TestEq<float,float>(y[vertices_from_xyz._4_4_],pfStack_20[vertices_from_xyz._4_4_ * 3],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x35,"void transpose_xyz_aos_to_soa(const char *)");
    TestEq<float,float>(z[vertices_from_xyz._4_4_],pfStack_20[vertices_from_xyz._4_4_ * 3 + 1],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x36,"void transpose_xyz_aos_to_soa(const char *)");
    TestEq<float,float>(pfStack_48[vertices_from_xyz._4_4_],
                        pfStack_20[vertices_from_xyz._4_4_ * 3 + 2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x37,"void transpose_xyz_aos_to_soa(const char *)");
  }
  pfStack_58 = (float *)trico_malloc((ulong)vertices._4_4_ * 0xc);
  anon_unknown.dwarf_cde::tic();
  trico_transpose_xyz_soa_to_aos(&stack0xffffffffffffffa8,y,z,pfStack_48,vertices._4_4_);
  anon_unknown.dwarf_cde::toc("transpose_xyz_soa_to_aos time: ");
  for (local_5c = 0; local_5c < vertices._4_4_; local_5c = local_5c + 1) {
    TestEq<float,float>(y[local_5c],pfStack_58[local_5c * 3],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x42,"void transpose_xyz_aos_to_soa(const char *)");
    TestEq<float,float>(z[local_5c],pfStack_58[local_5c * 3 + 1],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x43,"void transpose_xyz_aos_to_soa(const char *)");
    TestEq<float,float>(pfStack_48[local_5c],pfStack_58[local_5c * 3 + 2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x44,"void transpose_xyz_aos_to_soa(const char *)");
  }
  trico_free(pfStack_58);
  trico_free(y);
  trico_free(z);
  trico_free(pfStack_48);
  trico_free(pfStack_20);
  trico_free(x);
  return;
}

Assistant:

void transpose_xyz_aos_to_soa(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  float* x = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* y = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* z = (float*)trico_malloc(sizeof(float)*nr_of_vertices);

  tic();
  trico_transpose_xyz_aos_to_soa(&x, &y, &z, vertices, nr_of_vertices);
  toc("transpose_xyz_aos_to_soa time: ");

  for (uint32_t i = 0; i < nr_of_vertices; ++i)
    {
    TEST_EQ(x[i], vertices[i * 3]);
    TEST_EQ(y[i], vertices[i * 3 + 1]);
    TEST_EQ(z[i], vertices[i * 3 + 2]);
    }

  float* vertices_from_xyz = (float*)trico_malloc(sizeof(float)*nr_of_vertices * 3);

  tic();
  trico_transpose_xyz_soa_to_aos(&vertices_from_xyz, x, y, z, nr_of_vertices);
  toc("transpose_xyz_soa_to_aos time: ");

  for (uint32_t i = 0; i < nr_of_vertices; ++i)
    {
    TEST_EQ(x[i], vertices_from_xyz[i * 3]);
    TEST_EQ(y[i], vertices_from_xyz[i * 3 + 1]);
    TEST_EQ(z[i], vertices_from_xyz[i * 3 + 2]);
    }

  trico_free(vertices_from_xyz);
  trico_free(x);
  trico_free(y);
  trico_free(z);
  trico_free(vertices);
  trico_free(triangles);
  }